

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

Value * duckdb::SecretDirectorySetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  DBConfig *pDVar1;
  pointer pSVar2;
  string local_30;
  
  pDVar1 = DBConfig::GetConfig(context);
  pSVar2 = unique_ptr<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>,_true>::
           operator->(&pDVar1->secret_manager);
  (*pSVar2->_vptr_SecretManager[10])(&local_30,pSVar2);
  Value::Value(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

Value SecretDirectorySetting::GetSetting(const ClientContext &context) {
	auto &config = DBConfig::GetConfig(context);
	return config.secret_manager->PersistentSecretPath();
}